

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

int mpc_test_pass(mpc_parser_t *p,char *s,void *d,_func_int_void_ptr_void_ptr *tester,
                 mpc_dtor_t destructor,_func_void_void_ptr *printer)

{
  int iVar1;
  mpc_result_t local_48;
  mpc_result_t r;
  _func_void_void_ptr *printer_local;
  mpc_dtor_t destructor_local;
  _func_int_void_ptr_void_ptr *tester_local;
  void *d_local;
  char *s_local;
  mpc_parser_t *p_local;
  
  r = (mpc_result_t)printer;
  printer_local = (_func_void_void_ptr *)destructor;
  destructor_local = (mpc_dtor_t)tester;
  tester_local = (_func_int_void_ptr_void_ptr *)d;
  d_local = s;
  s_local = (char *)p;
  iVar1 = mpc_parse("<test>",s,p,&local_48);
  if (iVar1 == 0) {
    mpc_err_print(local_48.error);
    mpc_err_delete(local_48.error);
    p_local._4_4_ = 0;
  }
  else {
    iVar1 = (*destructor_local)(local_48.error);
    if (iVar1 == 0) {
      printf("Got ");
      (*(code *)r)(local_48.error);
      printf("\n");
      printf("Expected ");
      (*(code *)r)(tester_local);
      printf("\n");
      (*printer_local)(local_48.error);
      p_local._4_4_ = 0;
    }
    else {
      (*printer_local)(local_48.error);
      p_local._4_4_ = 1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int mpc_test_pass(mpc_parser_t *p, const char *s, const void *d,
  int(*tester)(const void*, const void*),
  mpc_dtor_t destructor,
  void(*printer)(const void*)) {

  mpc_result_t r;
  if (mpc_parse("<test>", s, p, &r)) {

    if (tester(r.output, d)) {
      destructor(r.output);
      return 1;
    } else {
      printf("Got "); printer(r.output); printf("\n");
      printf("Expected "); printer(d); printf("\n");
      destructor(r.output);
      return 0;
    }

  } else {
    mpc_err_print(r.error);
    mpc_err_delete(r.error);
    return 0;

  }

}